

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

string * __thiscall
duckdb::StringifyAndFree_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,yyjson_mut_doc *doc,yyjson_mut_val *object)

{
  char *__s;
  size_t sVar1;
  string *extraout_RAX;
  InternalException *this_00;
  string local_48;
  
  __s = duckdb_yyjson::yyjson_mut_val_write_opts
                  ((yyjson_mut_val *)doc,9,(yyjson_alc *)0x0,(usize *)0x0,(yyjson_write_err *)0x0);
  if (__s != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
    free(__s);
    duckdb_yyjson::yyjson_mut_doc_free((yyjson_mut_doc *)this);
    return extraout_RAX;
  }
  duckdb_yyjson::yyjson_mut_doc_free((yyjson_mut_doc *)this);
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"The plan could not be rendered as JSON, yyjson failed","");
  InternalException::InternalException(this_00,&local_48);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string StringifyAndFree(yyjson_mut_doc *doc, yyjson_mut_val *object) {
	auto data = yyjson_mut_val_write_opts(object, YYJSON_WRITE_ALLOW_INF_AND_NAN | YYJSON_WRITE_PRETTY, nullptr,
	                                      nullptr, nullptr);
	if (!data) {
		yyjson_mut_doc_free(doc);
		throw InternalException("The plan could not be rendered as JSON, yyjson failed");
	}
	auto result = string(data);
	free(data);
	yyjson_mut_doc_free(doc);
	return result;
}